

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMReX_Derive.cpp
# Opt level: O2

void __thiscall amrex::DeriveRec::buildBC(DeriveRec *this,DescriptorList *d_list)

{
  StateRange *pSVar1;
  int *piVar2;
  StateDescriptor *this_00;
  BCRec *pBVar3;
  int j;
  long lVar4;
  int k;
  int iVar5;
  ulong uVar6;
  StateRange **ppSVar7;
  
  if (this->bcr != (int *)0x0) {
    operator_delete__(this->bcr);
  }
  uVar6 = 0xffffffffffffffff;
  if (-1 < (long)this->n_state) {
    uVar6 = (long)this->n_state * 0x18;
  }
  piVar2 = (int *)operator_new__(uVar6);
  this->bcr = piVar2;
  ppSVar7 = &this->rng;
  while (pSVar1 = *ppSVar7, pSVar1 != (StateRange *)0x0) {
    this_00 = DescriptorList::operator[](d_list,pSVar1->typ);
    for (iVar5 = 0; iVar5 < pSVar1->nc; iVar5 = iVar5 + 1) {
      pBVar3 = StateDescriptor::getBC(this_00,pSVar1->sc + iVar5);
      for (lVar4 = 0; lVar4 != 6; lVar4 = lVar4 + 1) {
        piVar2[lVar4] = pBVar3->bc[lVar4];
      }
      piVar2 = piVar2 + 6;
    }
    ppSVar7 = &pSVar1->next;
  }
  return;
}

Assistant:

void
DeriveRec::buildBC (const DescriptorList& d_list)
{
    BL_ASSERT(nsr > 0);
    delete [] bcr;
    bcr = new int[2*AMREX_SPACEDIM*n_state];
    int* bci = bcr;
    for (DeriveRec::StateRange* r = rng; r != 0; r = r->next)
    {
        const StateDescriptor& d = d_list[r->typ];

        for (int k = 0; k < r->nc; k++)
        {
            const int* bc = d.getBC(r->sc + k).vect();

            for (int j = 0; j < 2*AMREX_SPACEDIM; j++)
            {
                bci[j] = bc[j];
            }
            bci += 2*AMREX_SPACEDIM;
        }
    }
}